

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntPushOrder(Vec_Int_t *p,int Entry)

{
  int local_18;
  int i;
  int Entry_local;
  Vec_Int_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_IntGrow(p,0x10);
    }
    else {
      Vec_IntGrow(p,p->nCap << 1);
    }
  }
  p->nSize = p->nSize + 1;
  for (local_18 = p->nSize + -2; (-1 < local_18 && (Entry < p->pArray[local_18]));
      local_18 = local_18 + -1) {
    p->pArray[local_18 + 1] = p->pArray[local_18];
  }
  p->pArray[local_18 + 1] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrder( Vec_Int_t * p, int Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( p->pArray[i] > Entry )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}